

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<double> * __thiscall
Matrix<double>::compile
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,uint beg_col,uint end_col)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  
  Matrix(__return_storage_ptr__,(this->m_shape).n_row,end_col - beg_col);
  if ((__return_storage_ptr__->m_shape).n_row != 0) {
    uVar4 = 0;
    do {
      if (beg_col < end_col) {
        lVar3 = 0;
        do {
          dVar1 = *(double *)
                   (*(long *)&(this->m_elems).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar4].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + (ulong)beg_col * 8 + lVar3 * 8);
          pvVar2 = operator[](__return_storage_ptr__,(uint)uVar4);
          (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar3] = dVar1;
          lVar3 = lVar3 + 1;
        } while ((ulong)end_col - (ulong)beg_col != lVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (__return_storage_ptr__->m_shape).n_row);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Matrix<T>::compile(unsigned beg_col, unsigned end_col) const{
    Matrix<T> matrix(m_shape.n_row, end_col-beg_col);

    for(unsigned i=0;i<matrix.m_shape.n_row;++i){
        for(unsigned j=beg_col;j<end_col;++j){
            matrix[i][j-beg_col]=m_elems[i][j];
        }
    }

    return matrix;
}